

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnumeric.cpp
# Opt level: O1

quint32 qFloatDistance(float a,float b)

{
  quint32 qVar1;
  int iVar2;
  float fVar3;
  float b_00;
  float fVar4;
  
  iVar2 = 0;
  while( true ) {
    if ((a == b) && (fVar3 = 0.0, !NAN(a) && !NAN(b))) goto LAB_00216c25;
    fVar4 = -b;
    fVar3 = -a;
    b_00 = fVar3;
    if (fVar3 <= a) {
      b_00 = a;
    }
    if (a < fVar3 != fVar4 <= b) break;
    b = (float)((uint)b & -(uint)(a < 0.0) | ~-(uint)(a < 0.0) & (uint)fVar4);
    qVar1 = qFloatDistance(0.0,b_00);
    iVar2 = iVar2 + qVar1;
    a = 0.0;
  }
  fVar4 = (float)(~-(uint)(a < 0.0) & (uint)b | (uint)fVar4 & -(uint)(a < 0.0));
  if (((a != 0.0) || (fVar3 = fVar4, NAN(a))) && ((b != 0.0 || (fVar3 = b_00, NAN(b))))) {
    fVar3 = fVar4;
    if (fVar4 < b_00) {
      fVar3 = b_00;
      b_00 = fVar4;
    }
    fVar3 = (float)((int)fVar3 - (int)b_00);
  }
LAB_00216c25:
  return iVar2 + (int)fVar3;
}

Assistant:

Q_CORE_EXPORT quint32 qFloatDistance(float a, float b)
{
    static const quint32 smallestPositiveFloatAsBits = 0x00000001;  // denormalized, (SMALLEST), (1.4E-45)
    /* Assumes:
       * IEE754 format.
       * Integers and floats have the same endian
    */
    static_assert(sizeof(quint32) == sizeof(float));
    Q_ASSERT(qIsFinite(a) && qIsFinite(b));
    if (a == b)
        return 0;
    if ((a < 0) != (b < 0)) {
        // if they have different signs
        if (a < 0)
            a = -a;
        else /*if (b < 0)*/
            b = -b;
        return qFloatDistance(0.0F, a) + qFloatDistance(0.0F, b);
    }
    if (a < 0) {
        a = -a;
        b = -b;
    }
    // at this point a and b should not be negative

    // 0 is special
    if (!a)
        return f2i(b) - smallestPositiveFloatAsBits + 1;
    if (!b)
        return f2i(a) - smallestPositiveFloatAsBits + 1;

    // finally do the common integer subtraction
    return a > b ? f2i(a) - f2i(b) : f2i(b) - f2i(a);
}